

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::str<char_const(&)[60],kj::Exception&>
          (String *__return_storage_ptr__,kj *this,char (*params) [60],Exception *params_1)

{
  Array<char> AStack_48;
  ArrayPtr<const_char> local_30;
  
  local_30 = toCharSequence<char_const(&)[60]>((char (*) [60])this);
  operator*(&AStack_48,params);
  _::concat<kj::ArrayPtr<char_const>,kj::String>
            (__return_storage_ptr__,(_ *)&local_30,(ArrayPtr<const_char> *)&AStack_48,
             &params_1->ownFile);
  Array<char>::~Array(&AStack_48);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}